

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_filter_bank_analysis.cc
# Opt level: O3

bool __thiscall
sptk::MelFilterBankAnalysis::GetCenterFrequencies
          (MelFilterBankAnalysis *this,vector<double,_std::allocator<double>_> *center_frequencies)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  double dVar4;
  
  bVar2 = (bool)(center_frequencies != (vector<double,_std::allocator<double>_> *)0x0 &
                this->is_valid_);
  if (bVar2 == true) {
    iVar1 = this->num_channel_;
    if ((long)(center_frequencies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(center_frequencies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)iVar1 + 1U) {
      std::vector<double,_std::allocator<double>_>::resize(center_frequencies,(long)iVar1 + 1U);
      iVar1 = this->num_channel_;
    }
    if (-1 < iVar1) {
      lVar3 = -1;
      do {
        dVar4 = expm1((this->center_frequencies_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar3 + 1] / 1127.0);
        (center_frequencies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar3 + 1] = dVar4 * 700.0;
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->num_channel_);
    }
  }
  return bVar2;
}

Assistant:

bool MelFilterBankAnalysis::GetCenterFrequencies(
    std::vector<double>* center_frequencies) const {
  if (!is_valid_ || NULL == center_frequencies) {
    return false;
  }

  if (center_frequencies->size() !=
      static_cast<std::size_t>(num_channel_ + 1)) {
    center_frequencies->resize(num_channel_ + 1);
  }

  for (int m(0); m <= num_channel_; ++m) {
    (*center_frequencies)[m] = MelToHz(center_frequencies_[m]);
  }

  return true;
}